

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetArgumentSetTypeName(ExpressionContext *ctx,IntrusiveList<TypeHandle> types)

{
  char *__src;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  TypeHandle *pTVar3;
  size_t sVar4;
  TypeHandle *local_58;
  TypeHandle *arg_1;
  char *pos;
  char *name;
  TypeHandle *arg;
  uint nameLength;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> types_local;
  char *__s;
  
  types_local.head = types.tail;
  arg._4_4_ = 2;
  local_58 = types.head;
  for (name = (char *)local_58; name != (char *)0x0; name = *(char **)(name + 8)) {
    uVar1 = InplaceStr::length((InplaceStr *)(*(long *)name + 0x10));
    arg._4_4_ = uVar1 + (*(long *)(name + 8) != 0) + arg._4_4_;
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(arg._4_4_ + 1U));
  __s = (char *)CONCAT44(extraout_var,iVar2);
  arg_1 = (TypeHandle *)(__s + 1);
  *__s = '(';
  for (; local_58 != (TypeHandle *)0x0; local_58 = local_58->next) {
    __src = (local_58->type->name).begin;
    uVar1 = InplaceStr::length(&local_58->type->name);
    memcpy(arg_1,__src,(ulong)uVar1);
    uVar1 = InplaceStr::length(&local_58->type->name);
    pTVar3 = (TypeHandle *)((long)&arg_1->type + (ulong)uVar1);
    arg_1 = pTVar3;
    if (local_58->next != (TypeHandle *)0x0) {
      arg_1 = (TypeHandle *)((long)&pTVar3->type + 1);
      *(undefined1 *)&pTVar3->type = 0x2c;
    }
  }
  *(undefined1 *)&arg_1->type = 0x29;
  *(undefined1 *)((long)&arg_1->type + 1) = 0;
  sVar4 = strlen(__s);
  if (sVar4 + 1 == (ulong)(arg._4_4_ + 1U)) {
    InplaceStr::InplaceStr((InplaceStr *)&types_local.tail,__s);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x148,
                "InplaceStr GetArgumentSetTypeName(ExpressionContext &, IntrusiveList<TypeHandle>)")
  ;
}

Assistant:

InplaceStr GetArgumentSetTypeName(ExpressionContext &ctx, IntrusiveList<TypeHandle> types)
{
	unsigned nameLength = 2;

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? 1 : 0);

	nameLength += 1;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '(';

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
	{
		memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = ')';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}